

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwatson.c
# Opt level: O0

int watson_write_from_buffer_to_buffer
              (IOFormat input,IOFormat output,char *source,size_t source_size,char *dest,
              size_t dest_size)

{
  Data data;
  int k;
  Data d;
  size_t dest_size_local;
  char *dest_local;
  size_t source_size_local;
  char *source_local;
  IOFormat output_local;
  IOFormat input_local;
  
  if ((source == (char *)0x0) || (dest == (char *)0x0)) {
    output_local = ~Watson;
  }
  else {
    data = (*decodeMap[input].parseString)(source,source_size);
    if (data == (Data)0x0) {
      output_local = ~Json;
    }
    else {
      output_local = (*decodeMap[output].writeToBuffer)(data,dest,dest_size);
      deepFreeData(data);
    }
  }
  return output_local;
}

Assistant:

int watson_write_from_buffer_to_buffer(IOFormat input, IOFormat output, char *source, size_t source_size, char *dest,
                                       size_t dest_size) {
    if (source == NULL || dest == NULL)return LIB_WATSON_INVALID_PARAMS;
    Data d = decodeMap[input].parseString(source, source_size);
    if (d == NULL)return LIB_WATSON_PARSE_ERROR;
    int k = decodeMap[output].writeToBuffer(d, dest, dest_size);
    deepFreeData(d);
    return k;
}